

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void hashkey(connectdata *conn,char *buf,size_t len,char **hostp)

{
  int iVar1;
  long local_38;
  long port;
  char *hostname;
  char **hostp_local;
  size_t len_local;
  char *buf_local;
  connectdata *conn_local;
  
  iVar1 = conn->remote_port;
  if (((*(ulong *)&(conn->bits).field_0x4 & 1) == 0) ||
     ((*(ulong *)&(conn->bits).field_0x4 >> 3 & 1) != 0)) {
    if ((*(ulong *)&(conn->bits).field_0x4 >> 8 & 1) == 0) {
      port = (long)(conn->host).name;
    }
    else {
      port = (long)(conn->conn_to_host).name;
    }
  }
  else {
    port = (long)(conn->http_proxy).host.name;
    iVar1 = conn->port;
  }
  local_38 = (long)iVar1;
  if (hostp != (char **)0x0) {
    *hostp = (char *)port;
  }
  curl_msnprintf(buf,len,"%ld%s",local_38,port);
  Curl_strntolower(buf,buf,len);
  return;
}

Assistant:

static void hashkey(struct connectdata *conn, char *buf,
                    size_t len,  /* something like 128 is fine */
                    const char **hostp)
{
  const char *hostname;
  long port = conn->remote_port;

#ifndef CURL_DISABLE_PROXY
  if(conn->bits.httpproxy && !conn->bits.tunnel_proxy) {
    hostname = conn->http_proxy.host.name;
    port = conn->port;
  }
  else
#endif
    if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
  else
    hostname = conn->host.name;

  if(hostp)
    /* report back which name we used */
    *hostp = hostname;

  /* put the number first so that the hostname gets cut off if too long */
  msnprintf(buf, len, "%ld%s", port, hostname);
  Curl_strntolower(buf, buf, len);
}